

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *p;
  void *pvVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  long lVar10;
  
  iVar2 = Abc_NtkLevel(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  p = Vec_PtrStart(iVar2 + 2);
  uVar7 = 0;
  uVar9 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar9 = uVar7;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    pAVar1 = ppNodes[uVar7];
    uVar3 = *(uint *)&pAVar1->field_0x14 & 0xf;
    if ((uVar3 != 2) && (uVar3 != 5)) {
      __assert_fail("Abc_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x157,
                    "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
    }
    Abc_NodeSetTravIdCurrent(pAVar1);
    if (0xfff < *(uint *)&pAVar1->field_0x14) {
      __assert_fail("pObj->Level == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x15a,
                    "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
    }
    pvVar5 = Vec_PtrEntry(p,0);
    (pAVar1->field_6).pTemp = pvVar5;
    Vec_PtrWriteEntry(p,*(uint *)&pAVar1->field_0x14 >> 0xc,pAVar1);
  }
  i = 0;
  do {
    if (iVar2 < i) {
      return p;
    }
    for (plVar6 = (long *)Vec_PtrEntry(p,i); plVar6 != (long *)0x0; plVar6 = (long *)plVar6[8]) {
      for (lVar8 = 0; lVar8 < *(int *)((long)plVar6 + 0x2c); lVar8 = lVar8 + 1) {
        pAVar1 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                  (long)*(int *)(plVar6[6] + lVar8 * 4) * 8);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar1);
        if (iVar4 == 0) {
          for (lVar10 = 0; iVar4 = (pAVar1->vFanins).nSize, lVar10 < iVar4; lVar10 = lVar10 + 1) {
            iVar4 = Abc_NodeIsTravIdCurrent
                              ((Abc_Obj_t *)
                               pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar10]]);
            if (iVar4 == 0) {
              iVar4 = (pAVar1->vFanins).nSize;
              break;
            }
          }
          if (iVar4 <= (int)lVar10) {
            Abc_NodeSetTravIdCurrent(pAVar1);
            uVar3 = *(uint *)&pAVar1->field_0x14;
            if (0xfffffffd < (uVar3 & 0xf) - 5) {
              uVar3 = uVar3 & 0xfff | iVar2 * 0x1000 + 0x1000U;
              *(uint *)&pAVar1->field_0x14 = uVar3;
            }
            pvVar5 = Vec_PtrEntry(p,uVar3 >> 0xc);
            (pAVar1->field_6).pTemp = pvVar5;
            Vec_PtrWriteEntry(p,*(uint *)&pAVar1->field_0x14 >> 0xc,pAVar1);
            if (0xfffffffd < (*(uint *)&pAVar1->field_0x14 & 0xf) - 5) {
              *(uint *)&pAVar1->field_0x14 = *(uint *)&pAVar1->field_0x14 & 0xfff;
            }
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, m, nLevels;
    // set the levels
    nLevels = Abc_NtkLevel( pNtk );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( nLevels + 2 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        // add to the array
        assert( pObj->Level == 0 );
        pObj->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pObj->Level );
        Vec_PtrWriteEntry( vNodes, pObj->Level, pObj );
    }
    // iterate through the levels
    for ( i = 0; i <= nLevels; i++ )
    {
        // iterate through the nodes on each level
        for ( pObj = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i); pObj; pObj = pObj->pCopy )
        {
            // iterate through the fanouts of each node
            Abc_ObjForEachFanout( pObj, pFanout, k )
            {
                // skip visited nodes
                if ( Abc_NodeIsTravIdCurrent(pFanout) )
                    continue;
                // visit the fanins of this fanout
                Abc_ObjForEachFanin( pFanout, pFanin, m )
                {
                    if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                        break;
                }
                if ( m < Abc_ObjFaninNum(pFanout) )
                    continue;
                // all fanins are already collected

                // mark the node as visited
                Abc_NodeSetTravIdCurrent( pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = nLevels + 1;
                // add to the array
                pFanout->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pFanout->Level );
                Vec_PtrWriteEntry( vNodes, pFanout->Level, pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = 0;
            }
        }
    }
    return vNodes;
}